

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall google::protobuf::TextFormat::Printer::TextGenerator::Outdent(TextGenerator *this)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  iVar1 = this->indent_level_;
  if ((iVar1 == 0) || (iVar1 < this->initial_indent_level_)) {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x4d0);
    other = internal::LogMessage::operator<<(&local_40," Outdent() without matching Indent().");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
  }
  else {
    this->indent_level_ = iVar1 + -1;
  }
  return;
}

Assistant:

void Outdent() override {
    if (indent_level_ == 0 || indent_level_ < initial_indent_level_) {
      GOOGLE_LOG(DFATAL) << " Outdent() without matching Indent().";
      return;
    }

    --indent_level_;
  }